

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

float ImGui::GetNavInputAmount(ImGuiNavInput n,ImGuiInputReadMode mode)

{
  float fVar1;
  undefined1 auVar2 [16];
  int iVar3;
  float fVar4;
  int iVar5;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  undefined8 uVar6;
  
  if (mode == ImGuiInputReadMode_Down) {
    return (GImGui->IO).NavInputs[n];
  }
  fVar1 = (GImGui->IO).NavInputsDownDuration[n];
  if ((mode == ImGuiInputReadMode_Released) && (fVar1 < 0.0)) {
    return (float)(-(uint)(0.0 <= (GImGui->IO).NavInputsDownDurationPrev[n]) & 0x3f800000);
  }
  fVar4 = 0.0;
  if (0.0 <= fVar1) {
    switch(mode) {
    case ImGuiInputReadMode_Pressed:
      return (float)(-(uint)(fVar1 == 0.0) & 0x3f800000);
    default:
      goto switchD_0014a144_caseD_2;
    case ImGuiInputReadMode_Repeat:
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        return 1.0;
      }
      fVar10 = (GImGui->IO).KeyRepeatDelay * 0.8;
      if (fVar1 <= fVar10) {
        return fVar4;
      }
      fVar11 = (GImGui->IO).KeyRepeatRate * 0.8;
      if (fVar11 <= 0.0) {
        return fVar4;
      }
      auVar7._0_4_ = fVar1 - fVar10;
      auVar7._4_4_ = (fVar1 - (GImGui->IO).DeltaTime) - fVar10;
      auVar7._8_4_ = 0.0 - fVar10;
      auVar7._12_4_ = 0.0 - fVar10;
      auVar2._4_4_ = fVar11;
      auVar2._0_4_ = fVar11;
      auVar2._8_4_ = fVar11;
      auVar2._12_4_ = fVar11;
      auVar9 = divps(auVar7,auVar2);
      uVar6 = auVar9._0_8_;
      goto LAB_0014a225;
    case ImGuiInputReadMode_RepeatSlow:
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        return 1.0;
      }
      fVar10 = (GImGui->IO).KeyRepeatDelay;
      if (fVar1 <= fVar10) {
        return fVar4;
      }
      fVar11 = (GImGui->IO).KeyRepeatRate;
      fVar11 = fVar11 + fVar11;
      break;
    case ImGuiInputReadMode_RepeatFast:
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        return 1.0;
      }
      fVar10 = (GImGui->IO).KeyRepeatDelay * 0.8;
      if (fVar1 <= fVar10) {
        return fVar4;
      }
      fVar11 = (GImGui->IO).KeyRepeatRate * 0.3;
    }
    if (0.0 < fVar11) {
      auVar8._0_4_ = fVar1 - fVar10;
      auVar8._4_4_ = (fVar1 - (GImGui->IO).DeltaTime) - fVar10;
      auVar8._8_4_ = 0.0 - fVar10;
      auVar8._12_4_ = 0.0 - fVar10;
      auVar9._4_4_ = fVar11;
      auVar9._0_4_ = fVar11;
      auVar9._8_4_ = fVar11;
      auVar9._12_4_ = fVar11;
      auVar9 = divps(auVar8,auVar9);
      uVar6 = auVar9._0_8_;
LAB_0014a225:
      iVar5 = (int)(float)uVar6 - (int)(float)((ulong)uVar6 >> 0x20);
      iVar3 = 0;
      if (0 < iVar5) {
        iVar3 = iVar5;
      }
      return (float)iVar3;
    }
  }
switchD_0014a144_caseD_2:
  return fVar4;
}

Assistant:

float ImGui::GetNavInputAmount(ImGuiNavInput n, ImGuiInputReadMode mode)
{
    ImGuiContext& g = *GImGui;
    if (mode == ImGuiInputReadMode_Down)
        return g.IO.NavInputs[n];                         // Instant, read analog input (0.0f..1.0f, as provided by user)

    const float t = g.IO.NavInputsDownDuration[n];
    if (t < 0.0f && mode == ImGuiInputReadMode_Released)  // Return 1.0f when just released, no repeat, ignore analog input.
        return (g.IO.NavInputsDownDurationPrev[n] >= 0.0f ? 1.0f : 0.0f);
    if (t < 0.0f)
        return 0.0f;
    if (mode == ImGuiInputReadMode_Pressed)               // Return 1.0f when just pressed, no repeat, ignore analog input.
        return (t == 0.0f) ? 1.0f : 0.0f;
    if (mode == ImGuiInputReadMode_Repeat)
        return (float)CalcTypematicPressedRepeatAmount(t, t - g.IO.DeltaTime, g.IO.KeyRepeatDelay * 0.80f, g.IO.KeyRepeatRate * 0.80f);
    if (mode == ImGuiInputReadMode_RepeatSlow)
        return (float)CalcTypematicPressedRepeatAmount(t, t - g.IO.DeltaTime, g.IO.KeyRepeatDelay * 1.00f, g.IO.KeyRepeatRate * 2.00f);
    if (mode == ImGuiInputReadMode_RepeatFast)
        return (float)CalcTypematicPressedRepeatAmount(t, t - g.IO.DeltaTime, g.IO.KeyRepeatDelay * 0.80f, g.IO.KeyRepeatRate * 0.30f);
    return 0.0f;
}